

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGccDepfileLexer.cxx
# Opt level: O2

void cmGccDepfile_yy_switch_to_buffer(YY_BUFFER_STATE_conflict new_buffer,yyscan_t yyscanner)

{
  YY_BUFFER_STATE_conflict pyVar1;
  long lVar2;
  long lVar3;
  
  cmGccDepfile_yyensure_buffer_stack(yyscanner);
  lVar2 = *(long *)((long)yyscanner + 0x28);
  if (lVar2 != 0) {
    lVar3 = *(long *)((long)yyscanner + 0x18);
    pyVar1 = *(YY_BUFFER_STATE_conflict *)(lVar2 + lVar3 * 8);
    if (pyVar1 != new_buffer) {
      if (pyVar1 != (YY_BUFFER_STATE_conflict)0x0) {
        **(undefined1 **)((long)yyscanner + 0x48) = *(undefined1 *)((long)yyscanner + 0x30);
        lVar3 = *(long *)((long)yyscanner + 0x18);
        lVar2 = *(long *)((long)yyscanner + 0x28);
        *(undefined8 *)(*(long *)(lVar2 + lVar3 * 8) + 0x10) =
             *(undefined8 *)((long)yyscanner + 0x48);
        *(undefined8 *)(*(long *)(lVar2 + lVar3 * 8) + 0x20) =
             *(undefined8 *)((long)yyscanner + 0x38);
      }
      *(YY_BUFFER_STATE_conflict *)(lVar2 + lVar3 * 8) = new_buffer;
      cmGccDepfile_yy_load_buffer_state(yyscanner);
      *(undefined4 *)((long)yyscanner + 0x58) = 1;
    }
  }
  return;
}

Assistant:

void yy_switch_to_buffer  (YY_BUFFER_STATE  new_buffer , yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

	/* TODO. We should be able to replace this entire function body
	 * with
	 *		yypop_buffer_state();
	 *		yypush_buffer_state(new_buffer);
     */
	yyensure_buffer_stack (yyscanner);
	if ( YY_CURRENT_BUFFER == new_buffer )
		return;

	if ( YY_CURRENT_BUFFER )
		{
		/* Flush out information for old buffer. */
		*yyg->yy_c_buf_p = yyg->yy_hold_char;
		YY_CURRENT_BUFFER_LVALUE->yy_buf_pos = yyg->yy_c_buf_p;
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = yyg->yy_n_chars;
		}

	YY_CURRENT_BUFFER_LVALUE = new_buffer;
	yy_load_buffer_state( yyscanner );

	/* We don't actually know whether we did this switch during
	 * EOF (yywrap()) processing, but the only time this flag
	 * is looked at is after yywrap() is called, so it's safe
	 * to go ahead and always set it.
	 */
	yyg->yy_did_buffer_switch_on_eof = 1;
}